

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall Network::~Network(Network *this)

{
  pointer ppPVar1;
  pointer ppSVar2;
  
  ppPVar1 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)(this->populations).
                                  super__Vector_base<Population_*,_std::allocator<Population_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar1)
    ;
  }
  ppSVar2 = (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->synapses).
                                  super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppSVar2);
    return;
  }
  return;
}

Assistant:

Network::~Network()
{
    
}